

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access-control.c
# Opt level: O3

void ndn_ac_after_bootstrapping(void)

{
  int iVar1;
  ndn_key_storage_t *component;
  int i;
  long lVar2;
  undefined1 local_1d8 [8];
  ndn_name_t name;
  uint8_t ac;
  
  if (!_ac_initialized) {
    _init_ac_state();
  }
  lVar2 = 0;
  do {
    if (_ac_self_state.self_services[lVar2] != 0xff) {
      _express_ekey_interest(_ac_self_state.self_services[lVar2]);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 10);
  ndn_time_delay(10);
  lVar2 = 0;
  do {
    if (_ac_self_state.access_services[lVar2] != 0xff) {
      _express_dkey_interest(_ac_self_state.access_services[lVar2]);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 10);
  ndn_name_init((ndn_name_t *)local_1d8);
  component = ndn_key_storage_get_instance();
  iVar1 = ndn_name_append_component((ndn_name_t *)local_1d8,(name_component_t *)component);
  ndn_name_print((ndn_name_t *)local_1d8);
  if (iVar1 == 0) {
    name.components[9]._43_1_ = 3;
    ndn_name_append_bytes_component((ndn_name_t *)local_1d8,&name.components[9].field_0x2b,1);
    iVar1 = ndn_name_append_string_component((ndn_name_t *)local_1d8,"NOTIFY",6);
    if (iVar1 == 0) {
      iVar1 = ndn_forwarder_register_name_prefix
                        ((ndn_name_t *)local_1d8,_on_ac_notification,(void *)0x0);
      ndn_name_print((ndn_name_t *)local_1d8);
      if (iVar1 != 0) {
        printf("ERROR: %s, L%d: ","ndn_ac_after_bootstrapping",0x239);
        printf("[ACCESSCTL] Cannot register notification prefix: ");
        ndn_name_print((ndn_name_t *)local_1d8);
      }
      _ac_timeout();
    }
  }
  return;
}

Assistant:

void
ndn_ac_after_bootstrapping()
{
  if (!_ac_initialized) {
    _init_ac_state();
  }
  // send /home/AC/EKEY/<the service provided by my self> to the controller
  for (int i = 0; i < 10; i++) {
    if (_ac_self_state.self_services[i] != NDN_SD_NONE) {
      _express_ekey_interest(_ac_self_state.self_services[i]);
    }
  }
  ndn_time_delay(10);
  // send /home/AC/DKEY/<the services that I need to access> to the controller
  for (int i = 0; i < 10; i++) {
    if (_ac_self_state.access_services[i] != NDN_SD_NONE) {
      _express_dkey_interest(_ac_self_state.access_services[i]);
    }
  }
  // e.g. Temp sensor produce under TEMP, access SD
  // 1. send /home/AC/EKEY/TEMP to obtain encryption key
  // 2. send /home/AC/DKEY/SD to obtain decryption key

  // register for notification interest
  ndn_name_t name;
  ndn_name_init(&name);
  ndn_key_storage_t* storage = ndn_key_storage_get_instance();
  int ret = -1;
  ret = ndn_name_append_component(&name, &storage->self_identity[0].components[0]);
    NDN_LOG_ERROR_NAME(&name);
  if (ret != 0) return;
  uint8_t ac = NDN_SD_AC;
  ret = ndn_name_append_bytes_component(&name, &ac, 1);

  // ret = ndn_name_append_string_component(&name, "AC", strlen("AC"));
  // if (ret != 0) return;
  ret = ndn_name_append_string_component(&name, "NOTIFY", strlen("NOTIFY"));
  if (ret != 0) return;
  ret = ndn_forwarder_register_name_prefix(&name, _on_ac_notification, NULL);
  NDN_LOG_ERROR_NAME(&name);
  if (ret != 0) {
    NDN_LOG_ERROR("[ACCESSCTL] Cannot register notification prefix: ");
    NDN_LOG_ERROR_NAME(&name);
  }
  _ac_timeout();
}